

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O3

void __thiscall Rml::BaseXMLParser::Parse(BaseXMLParser *this,Stream *stream)

{
  int iVar1;
  URL *pUVar2;
  undefined4 extraout_var;
  
  pUVar2 = Stream::GetSourceURL(stream);
  this->source_url = pUVar2;
  (this->xml_source)._M_string_length = 0;
  *(this->xml_source)._M_dataplus._M_p = '\0';
  iVar1 = (*stream->_vptr_Stream[4])(stream);
  (*stream->_vptr_Stream[9])(stream,&this->xml_source,CONCAT44(extraout_var,iVar1));
  this->xml_index = 0;
  this->line_number = 1;
  this->line_number_open_tag = 1;
  this->inner_xml_data = false;
  this->inner_xml_data_terminate_depth = 0;
  this->inner_xml_data_index_begin = 0;
  ReadHeader(this);
  ReadBody(this);
  (this->xml_source)._M_string_length = 0;
  *(this->xml_source)._M_dataplus._M_p = '\0';
  this->source_url = (URL *)0x0;
  return;
}

Assistant:

void BaseXMLParser::Parse(Stream* stream)
{
	source_url = &stream->GetSourceURL();

	xml_source.clear();

	// We read in the whole XML file here.
	// TODO: It doesn't look like the Stream interface is used for anything useful. We
	//   might as well just use a span or StringView, and get completely rid of it.
	// @performance Otherwise, use the temporary allocator.
	const size_t source_size = stream->Length();
	stream->Read(xml_source, source_size);

	xml_index = 0;
	line_number = 1;
	line_number_open_tag = 1;

	inner_xml_data = false;
	inner_xml_data_terminate_depth = 0;
	inner_xml_data_index_begin = 0;

	// Read (er ... skip) the header, if one exists.
	ReadHeader();
	// Read the XML body.
	ReadBody();

	xml_source.clear();
	source_url = nullptr;
}